

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::TransformationParameter::InternalSerializeWithCachedSizesToArray
          (TransformationParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  bool bVar2;
  uint32 value;
  int size;
  char *data;
  string *value_00;
  UnknownFieldSet *unknown_fields;
  float value_01;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  TransformationParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 0x20) != 0) {
    value_01 = scale(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(1,value_01,target);
  }
  if ((uVar1 & 4) != 0) {
    bVar2 = mirror(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(2,bVar2,puStack_40);
  }
  if ((uVar1 & 2) != 0) {
    value = crop_size(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3,value,puStack_40);
  }
  if ((uVar1 & 1) != 0) {
    mean_file_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    mean_file_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"caffe.TransformationParameter.mean_file");
    value_00 = mean_file_abi_cxx11_(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteStringToArray
                           (4,value_00,puStack_40);
  }
  puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                         (5,&this->mean_value_,puStack_40);
  if ((uVar1 & 8) != 0) {
    bVar2 = force_color(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(6,bVar2,puStack_40);
  }
  if ((uVar1 & 0x10) != 0) {
    bVar2 = force_gray(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(7,bVar2,puStack_40);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = TransformationParameter::unknown_fields(this);
    puStack_40 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* TransformationParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.TransformationParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional float scale = 1 [default = 1];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(1, this->scale(), target);
  }

  // optional bool mirror = 2 [default = false];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->mirror(), target);
  }

  // optional uint32 crop_size = 3 [default = 0];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3, this->crop_size(), target);
  }

  // optional string mean_file = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->mean_file().data(), this->mean_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.TransformationParameter.mean_file");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->mean_file(), target);
  }

  // repeated float mean_value = 5;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(5, this->mean_value_, target);

  // optional bool force_color = 6 [default = false];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(6, this->force_color(), target);
  }

  // optional bool force_gray = 7 [default = false];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(7, this->force_gray(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.TransformationParameter)
  return target;
}